

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1load.c
# Opt level: O1

FT_Error T1_Get_MM_Blend(T1_Face face,FT_UInt num_coords,FT_Fixed *coords)

{
  uint axis_count;
  PS_Blend pPVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  FT_UInt FVar5;
  FT_Error FVar6;
  FT_Fixed axiscoords [4];
  FT_Fixed aFStack_48 [4];
  
  pPVar1 = face->blend;
  if (pPVar1 == (PS_Blend)0x0) {
    FVar6 = 6;
  }
  else {
    axis_count = pPVar1->num_axis;
    mm_weights_unmap(pPVar1->weight_vector,aFStack_48,axis_count);
    FVar5 = num_coords;
    if (axis_count < num_coords) {
      FVar5 = axis_count;
    }
    FVar6 = 0;
    uVar2 = 0;
    if (FVar5 != 0) {
      uVar4 = (ulong)num_coords;
      if (axis_count < num_coords) {
        uVar4 = (ulong)axis_count;
      }
      memcpy(coords,aFStack_48,uVar4 << 3);
      uVar2 = FVar5;
    }
    if (uVar2 < num_coords) {
      uVar4 = (ulong)axis_count;
      if (num_coords <= axis_count) {
        uVar4 = (ulong)num_coords;
      }
      FVar6 = 0;
      lVar3 = 0;
      do {
        coords[uVar4 + lVar3] = 0x8000;
        lVar3 = lVar3 + 1;
      } while (num_coords - FVar5 != (int)lVar3);
    }
  }
  return FVar6;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  T1_Get_MM_Blend( T1_Face    face,
                   FT_UInt    num_coords,
                   FT_Fixed*  coords )
  {
    PS_Blend  blend = face->blend;

    FT_Fixed  axiscoords[4];
    FT_UInt   i, nc;


    if ( !blend )
      return FT_THROW( Invalid_Argument );

    mm_weights_unmap( blend->weight_vector,
                      axiscoords,
                      blend->num_axis );

    nc = num_coords;
    if ( num_coords > blend->num_axis )
    {
      FT_TRACE2(( "T1_Get_MM_Blend: only using first %d of %d coordinates\n",
                  blend->num_axis, num_coords ));
      nc = blend->num_axis;
    }

    for ( i = 0; i < nc; i++ )
      coords[i] = axiscoords[i];
    for ( ; i < num_coords; i++ )
      coords[i] = 0x8000;

    return FT_Err_Ok;
  }